

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

ALboolean alIsExtensionPresent(ALchar *extname)

{
  char cVar1;
  int iVar2;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alIsExtensionPresent);
  IO_STRING(extname);
  iVar2 = strcasecmp(extname,"AL_EXT_trace_info");
  if (iVar2 == 0) {
    cVar1 = '\x01';
  }
  else {
    cVar1 = (*REAL_alIsExtensionPresent)(extname);
  }
  writele32((int)cVar1);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return cVar1;
}

Assistant:

ALboolean alIsExtensionPresent(const ALchar *extname)
{
    ALboolean retval;
    IO_START(alIsExtensionPresent);
    IO_STRING(extname);
    if (strcasecmp(extname, "AL_EXT_trace_info") == 0) {
        retval = AL_TRUE;
    } else {
        retval = REAL_alIsExtensionPresent(extname);
    }
    IO_BOOLEAN(retval);
    IO_END();
    return retval;
}